

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O2

GCudata * lj_udata_new(lua_State *L,MSize sz,GCtab *env)

{
  uint uVar1;
  GCudata *pGVar2;
  ulong uVar3;
  
  pGVar2 = (GCudata *)lj_mem_realloc(L,(void *)0x0,0,sz + 0x18);
  uVar3 = (ulong)(L->glref).ptr32;
  pGVar2->marked = *(byte *)(uVar3 + 0x58) & 3;
  pGVar2->gct = '\f';
  pGVar2->udtype = '\0';
  pGVar2->len = sz;
  (pGVar2->metatable).gcptr32 = 0;
  (pGVar2->env).gcptr32 = (uint32_t)env;
  uVar1 = *(uint *)(uVar3 + 0x110);
  (pGVar2->nextgc).gcptr32 = *(uint32_t *)(ulong)uVar1;
  *(uint32_t *)(ulong)uVar1 = (uint32_t)pGVar2;
  *(long *)(uVar3 + 0xd8) = *(long *)(uVar3 + 0xd8) + 1;
  return pGVar2;
}

Assistant:

GCudata *lj_udata_new(lua_State *L, MSize sz, GCtab *env)
{
  GCudata *ud = lj_mem_newt(L, sizeof(GCudata) + sz, GCudata);
  global_State *g = G(L);
  newwhite(g, ud);  /* Not finalized. */
  ud->gct = ~LJ_TUDATA;
  ud->udtype = UDTYPE_USERDATA;
  ud->len = sz;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcrefnull(ud->metatable);
  setgcref(ud->env, obj2gco(env));
  /* Chain to userdata list (after main thread). */
  setgcrefr(ud->nextgc, mainthread(g)->nextgc);
  setgcref(mainthread(g)->nextgc, obj2gco(ud));
  g->gc.udatanum++;
  return ud;
}